

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O0

pair<double,_double> __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::compute_minimum_maximum
          (Persistence_landscape_on_grid *this)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  double dVar5;
  pair<double,_double> pVar6;
  size_type local_38;
  size_t i;
  double min_value;
  double max_value;
  Persistence_landscape_on_grid *this_local;
  
  max_value = (double)this;
  dVar5 = std::numeric_limits<double>::max();
  min_value = -dVar5;
  i = 0;
  for (local_38 = 0;
      sVar1 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&this->values_of_landscapes), local_38 != sVar1; local_38 = local_38 + 1) {
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->values_of_landscapes,local_38);
    sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
    if (sVar1 != 0) {
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->values_of_landscapes,local_38);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
      if (min_value < *pvVar3) {
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->values_of_landscapes,local_38);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
        min_value = *pvVar3;
      }
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->values_of_landscapes,local_38);
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->values_of_landscapes,local_38);
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,sVar1 - 1);
      if (min_value < *pvVar3) {
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->values_of_landscapes,local_38);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->values_of_landscapes,local_38);
        sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,sVar1 - 1);
        min_value = *pvVar3;
      }
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->values_of_landscapes,local_38);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
      if (*pvVar3 < (double)i) {
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->values_of_landscapes,local_38);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,0);
        i = (size_t)*pvVar3;
      }
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->values_of_landscapes,local_38);
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->values_of_landscapes,local_38);
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,sVar1 - 1);
      if (*pvVar3 < (double)i) {
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->values_of_landscapes,local_38);
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->values_of_landscapes,local_38);
        sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,sVar1 - 1);
        i = (size_t)*pvVar3;
      }
    }
  }
  pVar6 = std::make_pair<double&,double&>((double *)&i,&min_value);
  return pVar6;
}

Assistant:

std::pair<double, double> compute_minimum_maximum() const {
    // since the function can only be entirely positive or negative, the maximal value will be an extremal value in the
    // arrays:
    double max_value = -std::numeric_limits<double>::max();
    double min_value = 0;
    for (size_t i = 0; i != this->values_of_landscapes.size(); ++i) {
      if (this->values_of_landscapes[i].size()) {
        if (this->values_of_landscapes[i][0] > max_value) max_value = this->values_of_landscapes[i][0];
        if (this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] > max_value)
          max_value = this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1];

        if (this->values_of_landscapes[i][0] < min_value) min_value = this->values_of_landscapes[i][0];
        if (this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] < min_value)
          min_value = this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1];
      }
    }
    return std::make_pair(min_value, max_value);
  }